

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkConstructFromCnf(Abc_Ntk_t *pNtk,Cnf_Man_t *p,Vec_Ptr_t *vMapped)

{
  Vec_Ptr_t *pVVar1;
  void *pvVar2;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar3;
  long lVar4;
  Vec_Int_t *vCover;
  int *__ptr;
  Vec_Ptr_t *pVVar5;
  char *pcVar6;
  Vec_Int_t *vCover_00;
  int iVar7;
  ulong uVar8;
  Mem_Flex_t *pMan;
  Abc_Ntk_t *pAVar9;
  long lVar10;
  
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
  pAVar3 = Abc_NtkCreateNodeConst1(pNtk_00);
  (p->pManAig->pConst1->field_5).pData = pAVar3;
  pVVar5 = pNtk->vCis;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      pVVar1 = p->pManAig->vCis;
      if (pVVar1->nSize <= lVar4) goto LAB_002a91de;
      *(undefined8 *)((long)pVVar1->pArray[lVar4] + 0x28) =
           *(undefined8 *)((long)pVVar5->pArray[lVar4] + 0x40);
      lVar4 = lVar4 + 1;
      pVVar5 = pNtk->vCis;
    } while (lVar4 < pVVar5->nSize);
  }
  vCover = (Vec_Int_t *)malloc(0x10);
  vCover->nCap = 0x10000;
  vCover->nSize = 0;
  __ptr = (int *)malloc(0x40000);
  vCover->pArray = __ptr;
  if (0 < vMapped->nSize) {
    lVar4 = 0;
    do {
      pvVar2 = vMapped->pArray[lVar4];
      pAVar3 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NODE);
      pcVar6 = *(char **)((long)pvVar2 + 0x28);
      uVar8 = (ulong)(uint)(int)*pcVar6;
      if (*pcVar6 < 1) {
LAB_002a909b:
        Cnf_SopConvertToVector
                  (p->pSops[*(ushort *)(pcVar6 + (long)(char)uVar8 * 4 + 0x18)],
                   (int)p->pSopSizes[*(ushort *)(pcVar6 + (long)(char)uVar8 * 4 + 0x18)],vCover);
        pMan = (Mem_Flex_t *)pNtk_00->pManFunc;
        iVar7 = (int)*pcVar6;
        vCover_00 = vCover;
      }
      else {
        pVVar5 = p->pManAig->vObjs;
        if (pVVar5 != (Vec_Ptr_t *)0x0) {
          lVar10 = 0;
          while( true ) {
            iVar7 = *(int *)(pcVar6 + lVar10 * 4 + 0x18);
            if (((long)iVar7 < 0) || (pVVar5->nSize <= iVar7)) goto LAB_002a91de;
            if (pVVar5->pArray[iVar7] == (void *)0x0) break;
            Abc_ObjAddFanin(pAVar3,*(Abc_Obj_t **)((long)pVVar5->pArray[iVar7] + 0x28));
            lVar10 = lVar10 + 1;
            uVar8 = (ulong)*pcVar6;
            if (((long)uVar8 <= lVar10) || (pVVar5 = p->pManAig->vObjs, pVVar5 == (Vec_Ptr_t *)0x0))
            break;
          }
        }
        iVar7 = (int)uVar8;
        if ((char)uVar8 < '\x05') goto LAB_002a909b;
        pMan = (Mem_Flex_t *)pNtk_00->pManFunc;
        vCover_00 = *(Vec_Int_t **)(pcVar6 + 0x10);
      }
      pcVar6 = Abc_SopCreateFromIsop(pMan,iVar7,vCover_00);
      (pAVar3->field_5).pData = pcVar6;
      *(Abc_Obj_t **)((long)pvVar2 + 0x28) = pAVar3;
      lVar4 = lVar4 + 1;
    } while (lVar4 < vMapped->nSize);
    __ptr = vCover->pArray;
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  free(vCover);
  pVVar5 = pNtk->vCos;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      pVVar1 = p->pManAig->vCos;
      if (pVVar1->nSize <= lVar4) {
LAB_002a91de:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar8 = *(ulong *)((long)pVVar1->pArray[lVar4] + 8);
      Abc_ObjAddFanin(*(Abc_Obj_t **)((long)pVVar5->pArray[lVar4] + 0x40),
                      (Abc_Obj_t *)
                      ((ulong)((uint)uVar8 & 1) ^ *(ulong *)((uVar8 & 0xfffffffffffffffe) + 0x28)));
      lVar4 = lVar4 + 1;
      pVVar5 = pNtk->vCos;
    } while (lVar4 < pVVar5->nSize);
  }
  pAVar3 = (Abc_Obj_t *)(p->pManAig->pConst1->field_5).pData;
  if ((pAVar3->vFanouts).nSize == 0) {
    Abc_NtkDeleteObj(pAVar3);
  }
  Abc_NtkLogicMakeSimpleCos(pNtk_00,1);
  pAVar9 = pNtk_00;
  iVar7 = Abc_NtkCheck(pNtk_00);
  if (iVar7 == 0) {
    Abc_Print((int)pAVar9,"Abc_NtkConstructFromCnf(): Network check has failed.\n");
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkConstructFromCnf( Abc_Ntk_t * pNtk, Cnf_Man_t * p, Vec_Ptr_t * vMapped )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pNode, * pNodeNew;
    Aig_Obj_t * pObj, * pLeaf;
    Cnf_Cut_t * pCut;
    Vec_Int_t * vCover;
    unsigned uTruth;
    int i, k, nDupGates;
    // create the new network
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    // make the mapper point to the new network
    Aig_ManConst1(p->pManAig)->pData = Abc_NtkCreateNodeConst1(pNtkNew);
    Abc_NtkForEachCi( pNtk, pNode, i )
        Aig_ManCi(p->pManAig, i)->pData = pNode->pCopy;
    // process the nodes in topological order
    vCover = Vec_IntAlloc( 1 << 16 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
    {
        // create new node
        pNodeNew = Abc_NtkCreateNode( pNtkNew );
        // add fanins according to the cut
        pCut = (Cnf_Cut_t *)pObj->pData;
        Cnf_CutForEachLeaf( p->pManAig, pCut, pLeaf, k )
            Abc_ObjAddFanin( pNodeNew, (Abc_Obj_t *)pLeaf->pData );
        // add logic function
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & *Cnf_CutTruth(pCut);
            Cnf_SopConvertToVector( p->pSops[uTruth], p->pSopSizes[uTruth], vCover );
            pNodeNew->pData = Abc_SopCreateFromIsop( (Mem_Flex_t *)pNtkNew->pManFunc, pCut->nFanins, vCover );
        }
        else
            pNodeNew->pData = Abc_SopCreateFromIsop( (Mem_Flex_t *)pNtkNew->pManFunc, pCut->nFanins, pCut->vIsop[1] );
        // save the node
        pObj->pData = pNodeNew;
    }
    Vec_IntFree( vCover );
    // add the CO drivers
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pObj = Aig_ManCo(p->pManAig, i);
        pNodeNew = Abc_ObjNotCond( (Abc_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        Abc_ObjAddFanin( pNode->pCopy, pNodeNew );
    }

    // remove the constant node if not used
    pNodeNew = (Abc_Obj_t *)Aig_ManConst1(p->pManAig)->pData;
    if ( Abc_ObjFanoutNum(pNodeNew) == 0 )
        Abc_NtkDeleteObj( pNodeNew );
    // minimize the node
//    Abc_NtkSweep( pNtkNew, 0 );
    // decouple the PO driver nodes to reduce the number of levels
    nDupGates = Abc_NtkLogicMakeSimpleCos( pNtkNew, 1 );
//    if ( nDupGates && If_ManReadVerbose(pIfMan) )
//        Abc_Print( 1, "Duplicated %d gates to decouple the CO drivers.\n", nDupGates );
    if ( !Abc_NtkCheck( pNtkNew ) )
        Abc_Print( 1, "Abc_NtkConstructFromCnf(): Network check has failed.\n" );
    return pNtkNew;
}